

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::EnumDescriptor::DebugString
          (EnumDescriptor *this,int depth,string *contents,DebugStringOptions *debug_string_options)

{
  int iVar1;
  int iVar2;
  string *value;
  EnumOptions *options;
  FileDescriptor *this_00;
  DescriptorPool *pool;
  EnumValueDescriptor *this_01;
  SubstituteArg local_4c0;
  SubstituteArg local_490;
  SubstituteArg local_460;
  SubstituteArg local_430;
  SubstituteArg local_400;
  SubstituteArg local_3d0;
  SubstituteArg local_3a0;
  SubstituteArg local_370;
  SubstituteArg local_340;
  SubstituteArg local_310;
  int local_2dc;
  undefined1 local_2d8 [4];
  int i;
  SubstituteArg local_2a8;
  SubstituteArg local_278;
  SubstituteArg local_248;
  SubstituteArg local_218;
  SubstituteArg local_1e8;
  SubstituteArg local_1b8;
  SubstituteArg local_188;
  SubstituteArg local_158;
  SubstituteArg local_128;
  undefined1 local_f8 [8];
  SourceLocationCommentPrinter comment_printer;
  allocator local_49;
  undefined1 local_48 [8];
  string prefix;
  DebugStringOptions *debug_string_options_local;
  string *contents_local;
  int depth_local;
  EnumDescriptor *this_local;
  
  prefix.field_2._8_8_ = debug_string_options;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_48,(long)(depth * 2),' ',&local_49);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  anon_unknown_1::SourceLocationCommentPrinter::
  SourceLocationCommentPrinter<google::protobuf::EnumDescriptor>
            ((SourceLocationCommentPrinter *)local_f8,this,(string *)local_48,
             (DebugStringOptions *)prefix.field_2._8_8_);
  anon_unknown_1::SourceLocationCommentPrinter::AddPreComment
            ((SourceLocationCommentPrinter *)local_f8,contents);
  strings::internal::SubstituteArg::SubstituteArg(&local_128,(string *)local_48);
  value = name_abi_cxx11_(this);
  strings::internal::SubstituteArg::SubstituteArg(&local_158,value);
  strings::internal::SubstituteArg::SubstituteArg(&local_188);
  strings::internal::SubstituteArg::SubstituteArg(&local_1b8);
  strings::internal::SubstituteArg::SubstituteArg(&local_1e8);
  strings::internal::SubstituteArg::SubstituteArg(&local_218);
  strings::internal::SubstituteArg::SubstituteArg(&local_248);
  strings::internal::SubstituteArg::SubstituteArg(&local_278);
  strings::internal::SubstituteArg::SubstituteArg(&local_2a8);
  strings::internal::SubstituteArg::SubstituteArg((SubstituteArg *)local_2d8);
  strings::SubstituteAndAppend
            (contents,"$0enum $1 {\n",&local_128,&local_158,&local_188,&local_1b8,&local_1e8,
             &local_218,&local_248,&local_278,&local_2a8,(SubstituteArg *)local_2d8);
  options = EnumDescriptor::options(this);
  this_00 = file(this);
  pool = FileDescriptor::pool(this_00);
  anon_unknown_1::FormatLineOptions(depth + 1,&options->super_Message,pool,contents);
  local_2dc = 0;
  while( true ) {
    iVar1 = local_2dc;
    iVar2 = value_count(this);
    if (iVar2 <= iVar1) break;
    this_01 = EnumDescriptor::value(this,local_2dc);
    EnumValueDescriptor::DebugString
              (this_01,depth + 1,contents,(DebugStringOptions *)prefix.field_2._8_8_);
    local_2dc = local_2dc + 1;
  }
  strings::internal::SubstituteArg::SubstituteArg(&local_310,(string *)local_48);
  strings::internal::SubstituteArg::SubstituteArg(&local_340);
  strings::internal::SubstituteArg::SubstituteArg(&local_370);
  strings::internal::SubstituteArg::SubstituteArg(&local_3a0);
  strings::internal::SubstituteArg::SubstituteArg(&local_3d0);
  strings::internal::SubstituteArg::SubstituteArg(&local_400);
  strings::internal::SubstituteArg::SubstituteArg(&local_430);
  strings::internal::SubstituteArg::SubstituteArg(&local_460);
  strings::internal::SubstituteArg::SubstituteArg(&local_490);
  strings::internal::SubstituteArg::SubstituteArg(&local_4c0);
  strings::SubstituteAndAppend
            (contents,"$0}\n",&local_310,&local_340,&local_370,&local_3a0,&local_3d0,&local_400,
             &local_430,&local_460,&local_490,&local_4c0);
  anon_unknown_1::SourceLocationCommentPrinter::AddPostComment
            ((SourceLocationCommentPrinter *)local_f8,contents);
  anon_unknown_1::SourceLocationCommentPrinter::~SourceLocationCommentPrinter
            ((SourceLocationCommentPrinter *)local_f8);
  std::__cxx11::string::~string((string *)local_48);
  return;
}

Assistant:

void EnumDescriptor::DebugString(int depth, string *contents,
                                 const DebugStringOptions&
                                 debug_string_options) const {
  string prefix(depth * 2, ' ');
  ++depth;

  SourceLocationCommentPrinter
      comment_printer(this, prefix, debug_string_options);
  comment_printer.AddPreComment(contents);

  strings::SubstituteAndAppend(contents, "$0enum $1 {\n",
                               prefix, name());

  FormatLineOptions(depth, options(), file()->pool(), contents);

  for (int i = 0; i < value_count(); i++) {
    value(i)->DebugString(depth, contents, debug_string_options);
  }
  strings::SubstituteAndAppend(contents, "$0}\n", prefix);

  comment_printer.AddPostComment(contents);
}